

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void DoIt(int maxDamageBinIdx,char *binFileName,char *idxFileName,bool useIndexFile,bool zip,
         bool validationCheck,bool allIntensityBinsCheck)

{
  undefined1 local_3130 [8];
  VulnerabilityToBin vTB;
  bool allIntensityBinsCheck_local;
  bool validationCheck_local;
  bool zip_local;
  bool useIndexFile_local;
  char *idxFileName_local;
  char *binFileName_local;
  int maxDamageBinIdx_local;
  
  vTB.vulnerabilityRows_.super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = allIntensityBinsCheck;
  vTB.vulnerabilityRows_.super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = validationCheck;
  vTB.vulnerabilityRows_.super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = zip;
  vTB.vulnerabilityRows_.super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = useIndexFile;
  VulnerabilityToBin::VulnerabilityToBin
            ((VulnerabilityToBin *)local_3130,maxDamageBinIdx,binFileName,idxFileName,useIndexFile,
             zip,allIntensityBinsCheck);
  Validate::SkipHeaderRow((Validate *)&vTB);
  VulnerabilityToBin::WriteHeader((VulnerabilityToBin *)local_3130);
  if ((vTB.vulnerabilityRows_.
       super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
    VulnerabilityToBin::ReadVulnerabilityFileNoChecks((VulnerabilityToBin *)local_3130);
  }
  else {
    ValidateVulnerability::ReadVulnerabilityFile((ValidateVulnerability *)local_3130);
    Validate::PrintSuccessMessage((Validate *)&vTB);
  }
  VulnerabilityToBin::~VulnerabilityToBin((VulnerabilityToBin *)local_3130);
  return;
}

Assistant:

void DoIt(const int maxDamageBinIdx, const char* binFileName,
	  const char* idxFileName, const bool useIndexFile, const bool zip,
	  const bool validationCheck, const bool allIntensityBinsCheck) {

  VulnerabilityToBin vTB(maxDamageBinIdx, binFileName, idxFileName,
			 useIndexFile, zip, allIntensityBinsCheck);
  vTB.SkipHeaderRow();
  vTB.WriteHeader();

  if (validationCheck) {

    vTB.ReadVulnerabilityFile();
    vTB.PrintSuccessMessage();

    return;

  }

  vTB.ReadVulnerabilityFileNoChecks();

}